

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

bool __thiscall Rml::Element::Focus(Element *this,bool focus_visible)

{
  Element **ppEVar1;
  bool bVar2;
  Context *this_00;
  Element *pEVar3;
  
  if (((((this->meta->computed_values).inherited.field_0x15 & 0x40) != 0) &&
      (this_00 = GetContext(this), this_00 != (Context *)0x0)) &&
     (bVar2 = Context::OnFocusChange(this_00,this,focus_visible), bVar2)) {
    pEVar3 = (Element *)0x0;
    do {
      this->focus = pEVar3;
      ppEVar1 = &this->parent;
      pEVar3 = this;
      this = *ppEVar1;
    } while (*ppEVar1 != (Element *)0x0);
    return true;
  }
  return false;
}

Assistant:

bool Element::Focus(bool focus_visible)
{
	// Are we allowed focus?
	Style::Focus focus_property = meta->computed_values.focus();
	if (focus_property == Style::Focus::None)
		return false;

	// Ask our context if we can switch focus.
	Context* context = GetContext();
	if (context == nullptr)
		return false;

	if (!context->OnFocusChange(this, focus_visible))
		return false;

	// Set this as the end of the focus chain.
	focus = nullptr;

	// Update the focus chain up the hierarchy.
	Element* element = this;
	while (Element* parent = element->GetParentNode())
	{
		parent->focus = element;
		element = parent;
	}

	return true;
}